

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  bool bVar1;
  DataType dataType;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  VarValue *value;
  string local_40;
  BasicUniform *local_20;
  BasicUniform *uniform_local;
  ostringstream *dst_local;
  UniformCase *this_local;
  
  local_20 = uniform;
  uniform_local = (BasicUniform *)dst;
  dst_local = (ostringstream *)this;
  bVar1 = glu::isDataTypeSampler(uniform->type);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)uniform_local,"compare_");
    dataType = getSamplerLookupReturnType(local_20->type);
    pcVar4 = glu::getDataTypeName(dataType);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"(texture(");
    poVar3 = std::operator<<(poVar3,(string *)local_20);
    poVar3 = std::operator<<(poVar3,", vec");
    iVar2 = getSamplerNumLookupDimensions(local_20->type);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,"(0.0))");
  }
  else {
    poVar3 = std::operator<<((ostream *)uniform_local,"compare_");
    pcVar4 = glu::getDataTypeName(local_20->type);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"(");
    std::operator<<(poVar3,(string *)local_20);
  }
  poVar3 = std::operator<<((ostream *)uniform_local,", ");
  shaderVarValueStr_abi_cxx11_(&local_40,(Functional *)&local_20->finalValue,value);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  std::operator<<(poVar3,")");
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
		dst << "compare_" << glu::getDataTypeName(getSamplerLookupReturnType(uniform.type)) << "(texture(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}